

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# t_interface.cpp
# Opt level: O0

void UI::interactive_mode(void)

{
  allocator<char> local_61;
  string local_60;
  allocator<char> local_29;
  string local_28;
  
  print_welcome();
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_28,
             " Katana can be quickly run with input arguments or be run interactively.",&local_29);
  print_ln(&local_28);
  std::__cxx11::string::~string((string *)&local_28);
  std::allocator<char>::~allocator(&local_29);
  std::allocator<char>::allocator();
  std::__cxx11::string::string<std::allocator<char>>
            ((string *)&local_60," Katana is currently running in interactive mode.",&local_61);
  print_ln(&local_60);
  std::__cxx11::string::~string((string *)&local_60);
  std::allocator<char>::~allocator(&local_61);
  skip_ln();
  main_menu();
  return;
}

Assistant:

void UI::interactive_mode()
{
    print_welcome();
    print_ln(" Katana can be quickly run with input arguments or be run interactively.");
    print_ln(" Katana is currently running in interactive mode.");
    skip_ln();
    main_menu();
}